

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factorizeAndRecompute
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  Type TVar2;
  Verbosity VVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  Verbosity old_verbosity;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000040;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000128;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002a0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002b0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  this_00 = in_RDI;
  iVar1 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::lastUpdate(&in_RDI->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
  if (0 < iVar1) {
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x75])();
  }
  computeFrhs(in_stack_00000128);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(unaff_retaddr,
          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this_00,
          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  TVar2 = type(in_RDI);
  if (TVar2 == LEAVE) {
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7d])();
  }
  else {
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7c])();
  }
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coSolve(unaff_retaddr,
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this_00,
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  computePvec(in_stack_00000040);
  forceRecompNonbasicValue(this_00);
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar3 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar3)) {
    VVar3 = SPxOut::getVerbosity(in_RDI->spxout);
    uVar4 = 4;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xfffffffffffffff0);
    soplex::operator<<((SPxOut *)CONCAT44(VVar3,uVar4),(char *)in_RDI);
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xfffffffffffffff4);
  }
  TVar2 = type(in_RDI);
  if (TVar2 == LEAVE) {
    computeFtest(in_stack_000002b0);
  }
  else {
    computeCoTest(in_stack_000002a0);
    computeTest(in_stack_000002b0);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::factorizeAndRecompute()
   {
      // refactorize to eliminate accumulated errors from LU updates
      if(this->lastUpdate() > 0)
         factorize();

      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);
      type() == LEAVE ? computeLeaveCoPrhs() : computeEnterCoPrhs();

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();

      forceRecompNonbasicValue();

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- checking feasibility and optimality\n")

      if(type() == LEAVE)
         computeFtest();
      else
      {
         computeCoTest();
         computeTest();
      }
   }